

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

TypedVector * __thiscall
flexbuffers::Reference::AsTypedVector(TypedVector *__return_storage_ptr__,Reference *this)

{
  byte bVar1;
  Type TVar2;
  ulong *puVar3;
  Type TVar4;
  uint8_t *puVar5;
  ulong uVar6;
  long lVar7;
  
  TVar2 = this->type_;
  if ((TVar2 - FBT_VECTOR_INT < 5) || (TVar2 == FBT_VECTOR_BOOL)) {
    puVar3 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar6 = (ulong)(byte)*puVar3;
      }
      else {
        uVar6 = (ulong)(ushort)*puVar3;
      }
    }
    else if (bVar1 < 8) {
      uVar6 = (ulong)(uint)*puVar3;
    }
    else {
      uVar6 = *puVar3;
    }
    bVar1 = this->byte_width_;
    if ((4 < TVar2 - FBT_VECTOR_INT) && (TVar2 != FBT_VECTOR_BOOL)) {
      __assert_fail("IsTypedVector(t)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                    ,0x74,"Type flexbuffers::ToTypedVectorElementType(Type)");
    }
    puVar5 = (uint8_t *)((long)puVar3 - uVar6);
    (__return_storage_ptr__->super_Sized).super_Object.data_ = puVar5;
    (__return_storage_ptr__->super_Sized).super_Object.byte_width_ = bVar1;
    lVar7 = -(ulong)bVar1;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar6 = (ulong)puVar5[lVar7];
      }
      else {
        uVar6 = (ulong)*(ushort *)(puVar5 + lVar7);
      }
    }
    else if (bVar1 < 8) {
      uVar6 = (ulong)*(uint *)(puVar5 + lVar7);
    }
    else {
      uVar6 = *(ulong *)(puVar5 + lVar7);
    }
    (__return_storage_ptr__->super_Sized).size_ = uVar6;
    TVar4 = FBT_KEY;
    if (TVar2 - FBT_VECTOR != FBT_STRING) {
      TVar4 = TVar2 - FBT_VECTOR;
    }
    __return_storage_ptr__->type_ = TVar4;
  }
  else {
    (__return_storage_ptr__->super_Sized).super_Object.data_ = "";
    (__return_storage_ptr__->super_Sized).super_Object.byte_width_ = '\x01';
    (__return_storage_ptr__->super_Sized).size_ = 0;
    __return_storage_ptr__->type_ = FBT_INT;
  }
  return __return_storage_ptr__;
}

Assistant:

bool IsTypedVector() const { return flexbuffers::IsTypedVector(type_); }